

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

void nhdp_domain_process_willingness_tlv
               (uint8_t *mprtypes,size_t mprtypes_size,rfc5444_reader_tlvblock_entry *tlv)

{
  list_entity *plVar1;
  nhdp_domain *pnVar2;
  byte bVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint uVar6;
  
  plVar1 = &_domain_list;
  puVar4 = &_flooding_domain._tmp_willingness;
  do {
    *puVar4 = '\0';
    plVar1 = plVar1->next;
    puVar4 = (uint8_t *)((long)&plVar1[-0x27].prev + 1);
  } while (plVar1->prev != _domain_list.prev);
  if (tlv != (rfc5444_reader_tlvblock_entry *)0x0) {
    uVar6 = *tlv->single_value & 0xf;
    _flooding_domain._tmp_willingness = (uint8_t)uVar6;
    if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2c4,(void *)0x0,0,
               "Received flooding willingness: %u",(ulong)uVar6);
    }
    for (uVar5 = 1; uVar5 - mprtypes_size != 1; uVar5 = uVar5 + 1) {
      pnVar2 = nhdp_domain_get_by_ext(mprtypes[uVar5 - 1]);
      if ((pnVar2 != (nhdp_domain *)0x0) && (uVar5 >> 1 < (ulong)tlv->length)) {
        if ((pnVar2->index & 1) == 0) {
          bVar3 = tlv->single_value[uVar5 >> 1] >> 4;
        }
        else {
          bVar3 = tlv->single_value[uVar5 >> 1] & 0xf;
        }
        pnVar2->_tmp_willingness = bVar3;
        if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
          oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2db,(void *)0x0,0,
                   "Received routing willingness for domain %u: %u",(ulong)pnVar2->ext,(ulong)bVar3)
          ;
        }
      }
    }
  }
  return;
}

Assistant:

void
nhdp_domain_process_willingness_tlv(
  uint8_t *mprtypes, size_t mprtypes_size, struct rfc5444_reader_tlvblock_entry *tlv) {
  struct nhdp_domain *domain;
  size_t idx, i;
  uint8_t value;

  _flooding_domain._tmp_willingness = RFC7181_WILLINGNESS_NEVER;
  list_for_each_element(&_domain_list, domain, _node) {
    domain->_tmp_willingness = RFC7181_WILLINGNESS_NEVER;
  }

  if (!tlv) {
    return;
  }

  /* copy flooding willingness */
  _flooding_domain._tmp_willingness = tlv->single_value[0] & RFC7181_WILLINGNESS_MASK;
  OONF_DEBUG(LOG_NHDP_R, "Received flooding willingness: %u", _flooding_domain._tmp_willingness);

  for (i = 0; i < mprtypes_size; i++) {
    domain = nhdp_domain_get_by_ext(mprtypes[i]);
    if (domain == NULL) {
      continue;
    }

    idx = (i + 1) / 2;
    if (idx >= tlv->length) {
      continue;
    }

    value = tlv->single_value[idx];
    if ((domain->index & 1) == 0) {
      value >>= RFC7181_WILLINGNESS_SHIFT;
    }
    else {
      value &= RFC7181_WILLINGNESS_MASK;
    }

    domain->_tmp_willingness = value;

    OONF_DEBUG(LOG_NHDP_R, "Received routing willingness for domain %u: %u", domain->ext, domain->_tmp_willingness);
  }
}